

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void e2e_concurrent_scan_test(void)

{
  time_t tVar1;
  long lVar2;
  long lVar3;
  fdb_config *pfVar4;
  undefined8 *puVar5;
  byte bVar6;
  fdb_config in_stack_fffffffffffffdd8;
  timeval __test_begin;
  fdb_config fconfig;
  
  bVar6 = 0;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  fdb_get_default_config();
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_mode = '\x01';
  fconfig.purging_interval = 0x1e;
  fconfig.seqtree_opt = '\x01';
  fconfig.durability_opt = '\x02';
  lVar3 = 0x1f;
  pfVar4 = &fconfig;
  puVar5 = (undefined8 *)&stack0xfffffffffffffdd8;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar5 = *(undefined8 *)pfVar4;
    pfVar4 = (fdb_config *)((long)pfVar4 + (ulong)bVar6 * -0x10 + 8);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  e2e_concurrent_scan_pattern(3,5,5,in_stack_fffffffffffffdd8,true);
  pfVar4 = &fconfig;
  puVar5 = (undefined8 *)&stack0xfffffffffffffdd8;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pfVar4;
    pfVar4 = (fdb_config *)((long)pfVar4 + (ulong)bVar6 * -0x10 + 8);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  e2e_concurrent_scan_pattern(3,5,5,in_stack_fffffffffffffdd8,false);
  memleak_end();
  fprintf(_stderr,"%s PASSED\n","TEST: e2e concurrent scan");
  return;
}

Assistant:

void e2e_concurrent_scan_test() {
    TEST_INIT();
    memleak_start();

    randomize();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode=FDB_COMPACTION_AUTO;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.purging_interval = 30; // retain deleted docs for iteration
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq

    // test
    e2e_concurrent_scan_pattern(3, 5, 5, fconfig, true);
    // normal_commit
    e2e_concurrent_scan_pattern(3, 5, 5, fconfig, false);

    memleak_end();
    TEST_RESULT("TEST: e2e concurrent scan");
}